

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_auxv.c
# Opt level: O0

int read_hex(char *str,unsigned_long *val)

{
  int iVar1;
  unsigned_long len;
  unsigned_long local_val;
  unsigned_long *val_local;
  char *str_local;
  
  len = 0;
  iVar1 = 0;
  val_local = (unsigned_long *)str;
  do {
    if (((char)*val_local < '0') || ('9' < (char)*val_local)) {
      if (((char)*val_local < 'a') || ('f' < (char)*val_local)) {
        if (((char)*val_local < 'A') || ('F' < (char)*val_local)) {
          *val = len;
          return iVar1;
        }
        len = len * 0x10 + (long)((char)*val_local + -0x37);
      }
      else {
        len = len * 0x10 + (long)((char)*val_local + -0x57);
      }
    }
    else {
      len = len * 0x10 + (long)((char)*val_local + -0x30);
    }
    iVar1 = iVar1 + 1;
    val_local = (unsigned_long *)((long)val_local + 1);
  } while( true );
}

Assistant:

static int read_hex(char *str, unsigned long *val) {
  unsigned long local_val = 0, len = 0;
  for (;;) {
    if (*str >= '0' && *str <= '9') {
      local_val = (local_val * 16) + (*str - '0');
      len++;
    } else if (*str >= 'a' && *str <= 'f') {
      local_val = (local_val * 16) + (*str - 'a' + 10);
      len++;
    } else if (*str >= 'A' && *str <= 'F') {
      local_val = (local_val * 16) + (*str - 'A' + 10);
      len++;
    } else {
      *val = local_val;
      return len;
    }
    str++;
  }
}